

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O0

int Dar2_LibCutMatch(Gia_Man_t *p,Vec_Int_t *vCutLits,uint uTruth)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int local_2c;
  int i;
  char *pPerm;
  uint uPhase;
  uint uTruth_local;
  Vec_Int_t *vCutLits_local;
  Gia_Man_t *p_local;
  
  iVar3 = Vec_IntSize(vCutLits);
  if (iVar3 == 4) {
    cVar1 = s_DarLib->pPhases[uTruth];
    pcVar2 = s_DarLib->pPerms4[(int)s_DarLib->pPerms[uTruth]];
    local_2c = 0;
    while( true ) {
      iVar3 = Vec_IntSize(vCutLits);
      if (iVar3 <= local_2c) break;
      iVar3 = Vec_IntEntry(vCutLits,(int)pcVar2[local_2c]);
      iVar3 = Abc_LitNotCond(iVar3,(uint)(int)cVar1 >> ((byte)local_2c & 0x1f) & 1);
      s_DarLib->pDatas[local_2c].field_0.iGunc = iVar3;
      pGVar4 = Gia_ObjFromLit(p,s_DarLib->pDatas[local_2c].field_0.iGunc);
      pGVar4 = Gia_Regular(pGVar4);
      iVar3 = Gia_ObjLevel(p,pGVar4);
      s_DarLib->pDatas[local_2c].Level = iVar3;
      local_2c = local_2c + 1;
    }
    return 1;
  }
  __assert_fail("Vec_IntSize(vCutLits) == 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darLib.c"
                ,0x425,"int Dar2_LibCutMatch(Gia_Man_t *, Vec_Int_t *, unsigned int)");
}

Assistant:

int Dar2_LibCutMatch( Gia_Man_t * p, Vec_Int_t * vCutLits, unsigned uTruth )
{
    unsigned uPhase;
    char * pPerm;
    int i;
    assert( Vec_IntSize(vCutLits) == 4 );
    // get the fanin permutation
    uPhase = s_DarLib->pPhases[uTruth];
    pPerm  = s_DarLib->pPerms4[ (int)s_DarLib->pPerms[uTruth] ];
    // collect fanins with the corresponding permutation/phase
    for ( i = 0; i < Vec_IntSize(vCutLits); i++ )
    {
//        pFanin = Gia_ManObj( p, pCut->pLeaves[ (int)pPerm[i] ] );
//        pFanin = Gia_ManObj( p, Vec_IntEntry( vCutLits, (int)pPerm[i] ) );
//        pFanin = Gia_ObjFromLit( p, Vec_IntEntry( vCutLits, (int)pPerm[i] ) );
        s_DarLib->pDatas[i].iGunc = Abc_LitNotCond( Vec_IntEntry(vCutLits, (int)pPerm[i]), ((uPhase >> i) & 1) );
        s_DarLib->pDatas[i].Level = Gia_ObjLevel( p, Gia_Regular(Gia_ObjFromLit(p, s_DarLib->pDatas[i].iGunc)) );
    }
    return 1;
}